

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ikcp.c
# Opt level: O0

void ikcp_update_ack(ikcpcb *kcp,IINT32 rtt)

{
  uint local_58;
  uint local_54;
  uint local_50;
  long local_48;
  long delta;
  IINT32 rto;
  IINT32 rtt_local;
  ikcpcb *kcp_local;
  
  if (kcp->rx_srtt == 0) {
    kcp->rx_srtt = rtt;
    kcp->rx_rttval = rtt / 2;
  }
  else {
    local_48 = (long)(rtt - kcp->rx_srtt);
    if (local_48 < 0) {
      local_48 = -local_48;
    }
    kcp->rx_rttval = (IINT32)((kcp->rx_rttval * 3 + local_48) / 4);
    kcp->rx_srtt = (kcp->rx_srtt * 7 + rtt) / 8;
    if (kcp->rx_srtt < 1) {
      kcp->rx_srtt = 1;
    }
  }
  local_50 = kcp->rx_rttval << 2;
  if (local_50 <= kcp->interval) {
    local_50 = kcp->interval;
  }
  local_54 = kcp->rx_srtt + local_50;
  if (local_54 <= (uint)kcp->rx_minrto) {
    local_54 = kcp->rx_minrto;
  }
  if (local_54 < 0xea61) {
    local_58 = local_54;
  }
  else {
    local_58 = 60000;
  }
  kcp->rx_rto = local_58;
  return;
}

Assistant:

static void ikcp_update_ack(ikcpcb *kcp, IINT32 rtt)
{
	IINT32 rto = 0;
	if (kcp->rx_srtt == 0) {
		kcp->rx_srtt = rtt;
		kcp->rx_rttval = rtt / 2;
	}	else {
		long delta = rtt - kcp->rx_srtt;
		if (delta < 0) delta = -delta;
		kcp->rx_rttval = (3 * kcp->rx_rttval + delta) / 4;
		kcp->rx_srtt = (7 * kcp->rx_srtt + rtt) / 8;
		if (kcp->rx_srtt < 1) kcp->rx_srtt = 1;
	}
	rto = kcp->rx_srtt + _imax_(kcp->interval, 4 * kcp->rx_rttval);
	kcp->rx_rto = _ibound_(kcp->rx_minrto, rto, IKCP_RTO_MAX);
}